

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

void __thiscall
cppnet::RWSocket::RWSocket(RWSocket *this,uint64_t sock,shared_ptr<cppnet::AlloterWrap> *alloter)

{
  shared_ptr<cppnet::AlloterWrap> *this_00;
  shared_ptr<cppnet::BlockMemoryPool> *this_01;
  __shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  Socket::Socket(&this->super_Socket,sock);
  (this->super_enable_shared_from_this<cppnet::RWSocket>)._M_weak_this.
  super___weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cppnet::RWSocket>)._M_weak_this.
  super___weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RWSocket_00125380;
  (this->super_CNSocket)._vptr_CNSocket = (_func_int **)&DAT_00125440;
  this_00 = &this->_alloter;
  this->_context = (void *)0x0;
  this->_timer_id = 0;
  this->_listen_port = 0;
  this->_shutdown = (__atomic_base<bool>)0x0;
  this->_connecting = (__atomic_base<bool>)0x0;
  this->_event = (Event *)0x0;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&this_00->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>,
             &alloter->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>);
  (this->_block_pool).super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->_block_pool).super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AlloterWrap::PoolNewSharePtr<cppnet::BlockMemoryPool,unsigned_short_const&,unsigned_short_const&>
            ((AlloterWrap *)&local_30,
             (unsigned_short *)
             (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&__mem_block_size);
  this_01 = &this->_block_pool;
  std::__shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_01->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  AlloterWrap::
  PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
            ((AlloterWrap *)&local_30,
             (shared_ptr<cppnet::BlockMemoryPool> *)
             (this_00->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (shared_ptr<cppnet::AlloterWrap> *)this_01);
  std::__shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_write_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  AlloterWrap::
  PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
            ((AlloterWrap *)&local_30,
             (shared_ptr<cppnet::BlockMemoryPool> *)
             (this_00->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (shared_ptr<cppnet::AlloterWrap> *)this_01);
  std::__shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_read_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

RWSocket::RWSocket(uint64_t sock, std::shared_ptr<AlloterWrap> alloter):
    Socket(sock),
    _context(nullptr),
    _timer_id(0),
    _listen_port(0),
    _shutdown(false),
    _connecting(false),
    _event(nullptr),
    _alloter(alloter) {

    _block_pool = _alloter->PoolNewSharePtr<BlockMemoryPool>(__mem_block_size, __mem_block_add_step);

    _write_buffer = _alloter->PoolNewSharePtr<BufferQueue>(_block_pool, _alloter);
    _read_buffer = _alloter->PoolNewSharePtr<BufferQueue>(_block_pool, _alloter);
}